

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexConcaveCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
cbtConvexTriangleCallback::setTimeStepAndCounters
          (cbtConvexTriangleCallback *this,cbtScalar collisionMarginTriangle,
          cbtDispatcherInfo *dispatchInfo,cbtCollisionObjectWrapper *convexBodyWrap,
          cbtCollisionObjectWrapper *triBodyWrap,cbtManifoldResult *resultOut)

{
  float fVar1;
  cbtScalar cVar2;
  cbtScalar cVar3;
  cbtScalar cVar4;
  ulong uVar5;
  undefined8 uVar6;
  cbtTransform *pcVar7;
  cbtCollisionShape *pcVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 local_98;
  undefined4 local_90;
  undefined4 local_8c;
  undefined8 local_88;
  undefined4 local_80;
  undefined4 local_7c;
  undefined8 local_78;
  undefined4 local_70;
  undefined4 local_6c;
  undefined1 local_68 [16];
  undefined4 local_58;
  float local_54;
  undefined4 local_50;
  undefined4 local_48;
  float local_44;
  undefined4 local_40;
  undefined4 local_38;
  float local_34;
  undefined4 local_30;
  float local_28;
  uint local_24;
  float local_20;
  
  this->m_convexBodyWrap = convexBodyWrap;
  this->m_triBodyWrap = triBodyWrap;
  this->m_dispatchInfoPtr = dispatchInfo;
  this->m_collisionMarginTriangle = collisionMarginTriangle;
  this->m_resultOut = resultOut;
  cbtTransform::inverse(triBodyWrap->m_worldTransform);
  auVar12._4_4_ = local_54;
  auVar12._0_4_ = local_54;
  auVar12._8_4_ = local_54;
  auVar12._12_4_ = local_54;
  auVar17._4_4_ = local_44;
  auVar17._0_4_ = local_44;
  auVar17._8_4_ = local_44;
  auVar17._12_4_ = local_44;
  auVar20._4_4_ = local_34;
  auVar20._0_4_ = local_34;
  auVar20._8_4_ = local_34;
  auVar20._12_4_ = local_34;
  auVar15._4_4_ = local_58;
  auVar15._0_4_ = local_58;
  auVar15._8_4_ = local_58;
  auVar15._12_4_ = local_58;
  auVar18._4_4_ = local_48;
  auVar18._0_4_ = local_48;
  auVar18._8_4_ = local_48;
  auVar18._12_4_ = local_48;
  auVar21._4_4_ = local_38;
  auVar21._0_4_ = local_38;
  auVar21._8_4_ = local_38;
  auVar21._12_4_ = local_38;
  auVar16._4_4_ = local_50;
  auVar16._0_4_ = local_50;
  auVar16._8_4_ = local_50;
  auVar16._12_4_ = local_50;
  auVar19._4_4_ = local_40;
  auVar19._0_4_ = local_40;
  auVar19._8_4_ = local_40;
  auVar19._12_4_ = local_40;
  auVar22._4_4_ = local_30;
  auVar22._0_4_ = local_30;
  auVar22._8_4_ = local_30;
  auVar22._12_4_ = local_30;
  pcVar7 = this->m_convexBodyWrap->m_worldTransform;
  fVar1 = (pcVar7->m_basis).m_el[1].m_floats[2];
  cVar2 = (pcVar7->m_basis).m_el[0].m_floats[2];
  cVar3 = (pcVar7->m_basis).m_el[2].m_floats[2];
  cVar4 = (pcVar7->m_origin).m_floats[2];
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(local_54 * fVar1)),ZEXT416((uint)cVar2),auVar15);
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * local_44)),ZEXT416((uint)cVar2),auVar18);
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(local_34 * fVar1)),auVar21,ZEXT416((uint)cVar2));
  cVar2 = (pcVar7->m_origin).m_floats[0];
  auVar25 = vfmadd231ss_fma(auVar13,ZEXT416((uint)cVar3),auVar16);
  auVar9 = vfmadd231ss_fma(auVar10,ZEXT416((uint)cVar3),auVar19);
  auVar14 = vfmadd231ss_fma(auVar14,auVar22,ZEXT416((uint)cVar3));
  fVar1 = (pcVar7->m_origin).m_floats[1];
  auVar10 = vmulss_avx512f(auVar17,ZEXT416((uint)fVar1));
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(local_54 * fVar1)),ZEXT416((uint)cVar2),auVar15);
  auVar11 = vfmadd231ss_avx512f(auVar10,ZEXT416((uint)cVar2),auVar18);
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(local_34 * fVar1)),auVar21,ZEXT416((uint)cVar2));
  auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)cVar4),auVar16);
  auVar11 = vfmadd231ss_avx512f(auVar11,ZEXT416((uint)cVar4),auVar19);
  auVar11 = vaddss_avx512f(auVar11,ZEXT416(local_24));
  auVar10 = vfmadd231ss_fma(auVar10,auVar22,ZEXT416((uint)cVar4));
  uVar5 = *(ulong *)(pcVar7->m_basis).m_el[1].m_floats;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(pcVar7->m_basis).m_el[2].m_floats;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar5;
  auVar12 = vmulps_avx512vl(auVar12,auVar24);
  auVar13 = vinsertps_avx(ZEXT416((uint)(auVar13._0_4_ + local_28)),auVar11,0x10);
  local_68 = vinsertps_avx(auVar13,ZEXT416((uint)(auVar10._0_4_ + local_20)),0x28);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(pcVar7->m_basis).m_el[0].m_floats;
  auVar13 = vfmadd231ps_fma(auVar12,auVar11,auVar15);
  auVar13 = vfmadd231ps_fma(auVar13,auVar23,auVar16);
  auVar10 = vmulps_avx512vl(auVar24,auVar17);
  auVar10 = vfmadd231ps_fma(auVar10,auVar11,auVar18);
  local_98 = vmovlps_avx(auVar13);
  local_90 = auVar25._0_4_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar5;
  auVar13 = vmulps_avx512vl(auVar25,auVar20);
  local_8c = 0;
  auVar13 = vfmadd231ps_fma(auVar13,auVar11,auVar21);
  auVar10 = vfmadd231ps_fma(auVar10,auVar23,auVar19);
  auVar13 = vfmadd231ps_fma(auVar13,auVar23,auVar22);
  local_88 = vmovlps_avx(auVar10);
  local_80 = auVar9._0_4_;
  local_7c = 0;
  local_78 = vmovlps_avx(auVar13);
  local_70 = auVar14._0_4_;
  local_6c = 0;
  pcVar8 = this->m_convexBodyWrap->m_shape;
  (*pcVar8->_vptr_cbtCollisionShape[2])(pcVar8,&local_98,&this->m_aabbMin,&this->m_aabbMax);
  uVar6 = *(undefined8 *)(this->m_aabbMax).m_floats;
  fVar1 = collisionMarginTriangle + resultOut->m_closestPointDistanceThreshold;
  auVar14._4_4_ = fVar1;
  auVar14._0_4_ = fVar1;
  auVar14._8_4_ = fVar1;
  auVar14._12_4_ = fVar1;
  auVar13._0_4_ = fVar1 + (float)uVar6;
  auVar13._4_4_ = fVar1 + (float)((ulong)uVar6 >> 0x20);
  auVar13._8_4_ = fVar1 + 0.0;
  auVar13._12_4_ = fVar1 + 0.0;
  uVar6 = vmovlps_avx(auVar13);
  *(undefined8 *)(this->m_aabbMax).m_floats = uVar6;
  (this->m_aabbMax).m_floats[2] = fVar1 + (this->m_aabbMax).m_floats[2];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(this->m_aabbMin).m_floats;
  auVar13 = vsubps_avx(auVar10,auVar14);
  uVar6 = vmovlps_avx(auVar13);
  *(undefined8 *)(this->m_aabbMin).m_floats = uVar6;
  (this->m_aabbMin).m_floats[2] = (this->m_aabbMin).m_floats[2] - fVar1;
  return;
}

Assistant:

void cbtConvexTriangleCallback::setTimeStepAndCounters(cbtScalar collisionMarginTriangle, const cbtDispatcherInfo& dispatchInfo, const cbtCollisionObjectWrapper* convexBodyWrap, const cbtCollisionObjectWrapper* triBodyWrap, cbtManifoldResult* resultOut)
{
	m_convexBodyWrap = convexBodyWrap;
	m_triBodyWrap = triBodyWrap;

	m_dispatchInfoPtr = &dispatchInfo;
	m_collisionMarginTriangle = collisionMarginTriangle;
	m_resultOut = resultOut;

	//recalc aabbs
	cbtTransform convexInTriangleSpace;
	convexInTriangleSpace = m_triBodyWrap->getWorldTransform().inverse() * m_convexBodyWrap->getWorldTransform();
	const cbtCollisionShape* convexShape = static_cast<const cbtCollisionShape*>(m_convexBodyWrap->getCollisionShape());
	//CollisionShape* triangleShape = static_cast<cbtCollisionShape*>(triBody->m_collisionShape);
	convexShape->getAabb(convexInTriangleSpace, m_aabbMin, m_aabbMax);
	cbtScalar extraMargin = collisionMarginTriangle + resultOut->m_closestPointDistanceThreshold;

	cbtVector3 extra(extraMargin, extraMargin, extraMargin);

	m_aabbMax += extra;
	m_aabbMin -= extra;
}